

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbdrmscreen.cpp
# Opt level: O0

void __thiscall QLinuxFbDevice::swapBuffers(QLinuxFbDevice *this,Output *output)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long in_RSI;
  QKmsDevice *in_RDI;
  long in_FS_OFFSET;
  int fbIdx;
  Framebuffer *fb;
  drmEventContext drmEvent;
  undefined4 local_30 [2];
  undefined8 local_28;
  code *local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = *(int *)(in_RSI + 0x168);
  iVar1 = QKmsDevice::fd(in_RDI);
  iVar2 = drmModePageFlip(iVar1,*(undefined4 *)(in_RSI + 0x20),
                          *(undefined4 *)(in_RSI + (long)iVar2 * 0x38 + 0xf8),1,in_RSI);
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    qErrnoWarning(*piVar3,"Page flip failed");
  }
  else {
    iVar2 = *(int *)(in_RSI + 0x168);
    while (*(int *)(in_RSI + 0x168) == iVar2) {
      memset(local_30,0xaa,0x28);
      memset(local_30,0,0x28);
      local_30[0] = 2;
      local_28 = 0;
      local_20 = pageFlipHandler;
      iVar1 = QKmsDevice::fd(in_RDI);
      drmHandleEvent(iVar1,local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLinuxFbDevice::swapBuffers(Output *output)
{
    Framebuffer &fb(output->fb[output->backFb]);
    if (drmModePageFlip(fd(), output->kmsOutput.crtc_id, fb.fb, DRM_MODE_PAGE_FLIP_EVENT, output) == -1) {
        qErrnoWarning(errno, "Page flip failed");
        return;
    }

    const int fbIdx = output->backFb;
    while (output->backFb == fbIdx) {
        drmEventContext drmEvent;
        memset(&drmEvent, 0, sizeof(drmEvent));
        drmEvent.version = 2;
        drmEvent.vblank_handler = nullptr;
        drmEvent.page_flip_handler = pageFlipHandler;
        // Blocks until there is something to read on the drm fd
        // and calls back pageFlipHandler once the flip completes.
        drmHandleEvent(fd(), &drmEvent);
    }
}